

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

char * bc_shell_quote(char *command)

{
  char c;
  bc_string_t *str;
  size_t sVar1;
  char *pcVar2;
  size_t i;
  ulong uVar3;
  
  str = bc_string_new();
  bc_string_append_c(str,'\'');
  if (command != (char *)0x0) {
    uVar3 = 0;
    while( true ) {
      sVar1 = strlen(command);
      if (sVar1 <= uVar3) break;
      c = command[uVar3];
      if (c == '\'') {
        pcVar2 = "\'\\\'\'";
LAB_00109b76:
        bc_string_append(str,pcVar2);
      }
      else {
        if (c == '!') {
          pcVar2 = "\'\\!\'";
          goto LAB_00109b76;
        }
        bc_string_append_c(str,c);
      }
      uVar3 = uVar3 + 1;
    }
  }
  bc_string_append_c(str,'\'');
  pcVar2 = bc_string_free(str,false);
  return pcVar2;
}

Assistant:

char*
bc_shell_quote(const char *command)
{
    bc_string_t *rv = bc_string_new();
    bc_string_append_c(rv, '\'');
    if (command != NULL) {
        for (size_t i = 0; i < strlen(command); i++) {
            switch (command[i]) {
                case '!':
                    bc_string_append(rv, "'\\!'");
                    break;
                case '\'':
                    bc_string_append(rv, "'\\''");
                    break;
                default:
                    bc_string_append_c(rv, command[i]);
            }
        }
    }
    bc_string_append_c(rv, '\'');
    return bc_string_free(rv, false);
}